

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O3

bool cmCMakePresetsGraphInternal::PresetStringHelper(string *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  int iVar2;
  code *local_60 [2];
  code *local_50;
  code *local_48;
  string local_40;
  
  if (PresetStringHelper(std::__cxx11::string&,Json::Value_const*,cmJSONState*)::helper_abi_cxx11_
      == '\0') {
    iVar2 = __cxa_guard_acquire(&PresetStringHelper(std::__cxx11::string&,Json::Value_const*,cmJSONState*)
                                 ::helper_abi_cxx11_);
    if (iVar2 != 0) {
      local_60[1] = (code *)0x0;
      local_60[0] = JsonErrors::INVALID_STRING;
      local_48 = std::
                 _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
                 ::_M_invoke;
      local_50 = std::
                 _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
                 ::_M_manager;
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
      cmJSONHelperBuilder::String
                (&PresetStringHelper(std::__cxx11::string&,Json::Value_const*,cmJSONState*)::
                  helper_abi_cxx11_,(ErrorGenerator *)local_60,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      if (local_50 != (_Manager_type)0x0) {
        (*local_50)((_Any_data *)local_60,(_Any_data *)local_60,__destroy_functor);
      }
      __cxa_atexit(std::_Function_base::~_Function_base,
                   &PresetStringHelper(std::__cxx11::string&,Json::Value_const*,cmJSONState*)::
                    helper_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&PresetStringHelper(std::__cxx11::string&,Json::Value_const*,cmJSONState*)
                           ::helper_abi_cxx11_);
    }
  }
  local_60[0] = (code *)value;
  local_40._M_dataplus._M_p = (pointer)state;
  if (PresetStringHelper(std::__cxx11::string&,Json::Value_const*,cmJSONState*)::helper_abi_cxx11_.
      super__Function_base._M_manager != (_Manager_type)0x0) {
    bVar1 = (*PresetStringHelper(std::__cxx11::string&,Json::Value_const*,cmJSONState*)::
              helper_abi_cxx11_._M_invoker)
                      ((_Any_data *)
                       &PresetStringHelper(std::__cxx11::string&,Json::Value_const*,cmJSONState*)::
                        helper_abi_cxx11_,out,(Value **)local_60,(cmJSONState **)&local_40);
    return bVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

bool PresetStringHelper(std::string& out, const Json::Value* value,
                        cmJSONState* state)
{
  static auto const helper = JSONHelperBuilder::String();
  return helper(out, value, state);
}